

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::UnaryExpr<std::optional<libchess::UCIGoParameters>_&>::streamReconstructedExpression
          (UnaryExpr<std::optional<libchess::UCIGoParameters>_&> *this,ostream *os)

{
  char local_20 [16];
  
  builtin_strncpy(local_20,"{?}",4);
  std::__ostream_insert<char,std::char_traits<char>>(os,local_20,3);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }